

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitFactor.c
# Opt level: O0

Kit_Graph_t * Kit_SopFactor(Vec_Int_t *vCover,int fCompl,int nVars,Vec_Int_t *vMemory)

{
  int iVar1;
  Kit_Edge_t eRoot_00;
  Kit_Edge_t eRoot;
  Kit_Graph_t *pFForm;
  Kit_Sop_t *cSop;
  Kit_Sop_t Sop;
  Vec_Int_t *vMemory_local;
  int nVars_local;
  int fCompl_local;
  Vec_Int_t *vCover_local;
  
  Sop.pCubes = (uint *)vMemory;
  if (nVars < 0x10) {
    iVar1 = Vec_IntSize(vCover);
    if (iVar1 == 0) {
      vCover_local = (Vec_Int_t *)Kit_GraphCreateConst0();
    }
    else {
      iVar1 = Vec_IntSize(vCover);
      if ((iVar1 == 1) && (iVar1 = Vec_IntEntry(vCover,0), iVar1 == 0)) {
        vCover_local = (Vec_Int_t *)Kit_GraphCreateConst1();
      }
      else {
        Vec_IntGrow((Vec_Int_t *)Sop.pCubes,0x100000);
        Kit_SopCreateInverse((Kit_Sop_t *)&cSop,vCover,nVars << 1,(Vec_Int_t *)Sop.pCubes);
        vCover_local = (Vec_Int_t *)Kit_GraphCreate(nVars);
        eRoot_00 = Kit_SopFactor_rec((Kit_Graph_t *)vCover_local,(Kit_Sop_t *)&cSop,nVars << 1,
                                     (Vec_Int_t *)Sop.pCubes);
        Kit_GraphSetRoot((Kit_Graph_t *)vCover_local,eRoot_00);
        if (fCompl != 0) {
          Kit_GraphComplement((Kit_Graph_t *)vCover_local);
        }
      }
    }
    return (Kit_Graph_t *)vCover_local;
  }
  __assert_fail("nVars < 16",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/kitFactor.c"
                ,0x40,"Kit_Graph_t *Kit_SopFactor(Vec_Int_t *, int, int, Vec_Int_t *)");
}

Assistant:

Kit_Graph_t * Kit_SopFactor( Vec_Int_t * vCover, int fCompl, int nVars, Vec_Int_t * vMemory )
{
    Kit_Sop_t Sop, * cSop = &Sop;
    Kit_Graph_t * pFForm;
    Kit_Edge_t eRoot;
//    int nCubes;

    // works for up to 15 variables because division procedure
    // used the last bit for marking the cubes going to the remainder
    assert( nVars < 16 );

    // check for trivial functions
    if ( Vec_IntSize(vCover) == 0 )
        return Kit_GraphCreateConst0();
    if ( Vec_IntSize(vCover) == 1 && Vec_IntEntry(vCover, 0) == 0 )
        return Kit_GraphCreateConst1();

    // prepare memory manager
//    Vec_IntClear( vMemory );
    Vec_IntGrow( vMemory, KIT_FACTOR_MEM_LIMIT );

    // perform CST
    Kit_SopCreateInverse( cSop, vCover, 2 * nVars, vMemory ); // CST

    // start the factored form
    pFForm = Kit_GraphCreate( nVars );
    // factor the cover
    eRoot = Kit_SopFactor_rec( pFForm, cSop, 2 * nVars, vMemory );
    // finalize the factored form
    Kit_GraphSetRoot( pFForm, eRoot );
    if ( fCompl )
        Kit_GraphComplement( pFForm );

    // verify the factored form
//    nCubes = Vec_IntSize(vCover);
//    Vec_IntShrink( vCover, nCubes );
//    if ( !Kit_SopFactorVerify( vCover, pFForm, nVars ) )
//        printf( "Verification has failed.\n" );
    return pFForm;
}